

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
ptc::Print<char>::print_backend<std::ofstream&,char_const(&)[5],char_const(&)[22]>
          (Print<char> *this,basic_ofstream<char,_std::char_traits<char>_> *os,char (*first) [5],
          char (*args) [22])

{
  size_type sVar1;
  char *pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  basic_ofstream<char,_std::char_traits<char>_> *pbVar8;
  undefined8 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  size_type *psVar11;
  ANSI local_44;
  basic_ofstream<char,_std::char_traits<char>_> *local_40;
  ANSI local_34;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)mutex_);
  if (iVar5 != 0) {
    uVar9 = std::__throw_system_error(iVar5);
    pthread_mutex_unlock((pthread_mutex_t *)mutex_);
    _Unwind_Resume(uVar9);
  }
  local_44 = first;
  bVar4 = is_escape<char[5]>(first,&local_44);
  if ((bVar4) || (sVar1 = (this->pattern)._M_string_length, sVar1 == 0)) {
    sVar7 = strlen(*first);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,*first,sVar7);
  }
  else {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(this->pattern)._M_dataplus._M_p,sVar1);
    sVar7 = strlen(*first);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,*first,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
  }
  local_44 = first;
  bVar4 = is_escape<char[5]>(first,&local_44);
  pbVar10 = &this->pattern;
  psVar11 = &(this->pattern)._M_string_length;
  sVar1 = (this->pattern)._M_string_length;
  if (bVar4) {
    if (sVar1 == 0) {
      sVar7 = strlen(*args);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,*args,sVar7);
      pbVar10 = &this->sep;
      psVar11 = &(this->sep)._M_string_length;
      pbVar8 = os;
    }
    else {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(pbVar10->_M_dataplus)._M_p,sVar1);
      local_40 = os;
      sVar7 = strlen(*args);
      os = local_40;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,*args,sVar7);
      pbVar8 = (basic_ofstream<char,_std::char_traits<char>_> *)
               std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(pbVar10->_M_dataplus)._M_p,*psVar11);
      pbVar10 = &this->sep;
      psVar11 = &(this->sep)._M_string_length;
    }
LAB_0012c9da:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pbVar8,(pbVar10->_M_dataplus)._M_p,*psVar11);
  }
  else {
    pcVar2 = (this->sep)._M_dataplus._M_p;
    sVar3 = (this->sep)._M_string_length;
    if (sVar1 != 0) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,pcVar2,sVar3);
      pbVar8 = (basic_ofstream<char,_std::char_traits<char>_> *)
               std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(pbVar10->_M_dataplus)._M_p,*psVar11);
      local_40 = os;
      sVar7 = strlen(*args);
      os = local_40;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar8,*args,sVar7);
      goto LAB_0012c9da;
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,pcVar2,sVar3);
    sVar7 = strlen(*args);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,*args,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,(this->end)._M_dataplus._M_p,(this->end)._M_string_length);
  local_44 = generic;
  bVar4 = is_escape<char[5]>(first,&local_44);
  if (!bVar4) {
    local_34 = generic;
    bVar4 = is_escape<char[22]>(args,&local_34);
    if (!bVar4) goto LAB_0012ca3c;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"\x1b[0m",4);
LAB_0012ca3c:
  if (this->flush == true) {
    std::ostream::flush();
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }